

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::RecursiveStructMemberIterator::prepNext(RecursiveStructMemberIterator *this)

{
  bool bVar1;
  reference __src;
  RecursiveStructMemberIterator *this_00;
  ConstantValue *pCVar2;
  iterator iVar3;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *in_RDI;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> fields;
  Type *type;
  Type *in_stack_ffffffffffffffd0;
  SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *in_stack_ffffffffffffffd8;
  RecursiveStructMemberIterator *in_stack_fffffffffffffff0;
  
  bVar1 = __gnu_cxx::
          operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                    ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                      *)in_stack_ffffffffffffffd0,
                     (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                      *)in_RDI);
  if (bVar1) {
    bVar1 = SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::empty
                      ((SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *)
                       &in_RDI[2]._M_extent);
    if (bVar1) {
      (in_RDI->_M_extent)._M_extent_value = 0;
    }
    else {
      __src = SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::back
                        ((SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *)
                         &in_RDI[2]._M_extent);
      memcpy(in_RDI,__src,0x28);
      SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::pop_back
                ((SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *)
                 in_stack_ffffffffffffffd0);
      State::next((State *)in_stack_ffffffffffffffd0);
      prepNext(in_stack_fffffffffffffff0);
    }
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
    ::operator*((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                 *)&in_RDI[1]._M_extent);
    this_00 = (RecursiveStructMemberIterator *)ValueSymbol::getType((ValueSymbol *)0xa5a5c3);
    bVar1 = Type::isUnpackedStruct((Type *)0xa5a5d2);
    if (bVar1) {
      SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
      emplace_back<slang::ast::RecursiveStructMemberIterator::State&>
                (in_stack_ffffffffffffffd8,(State *)in_stack_ffffffffffffffd0);
      Type::getCanonicalType(in_stack_ffffffffffffffd0);
      Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0xa5a5fd);
      (in_RDI->_M_extent)._M_extent_value = (size_t)this_00;
      pCVar2 = slang::ConstantValue::at((ConstantValue *)in_stack_ffffffffffffffd0,(size_t)in_RDI);
      in_RDI->_M_ptr = (pointer)pCVar2;
      iVar3 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin(in_RDI)
      ;
      in_RDI[1]._M_extent._M_extent_value = (size_t)iVar3._M_current;
      iVar3 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                        (iVar3._M_current);
      in_RDI[2]._M_ptr = iVar3._M_current;
      in_RDI[1]._M_ptr = (pointer)0x0;
      prepNext(this_00);
    }
  }
  return;
}

Assistant:

void prepNext() {
        if (curr.fieldIt == curr.fieldEnd) {
            if (stack.empty()) {
                curr.type = nullptr;
                return;
            }

            curr = stack.back();
            stack.pop_back();

            curr.next();
            prepNext();
        }
        else {
            auto& type = (*curr.fieldIt)->getType();
            if (type.isUnpackedStruct()) {
                stack.emplace_back(curr);

                auto fields = type.getCanonicalType().as<UnpackedStructType>().fields;
                curr.type = &type;
                curr.val = &curr.val->at(curr.valIndex);
                curr.fieldIt = fields.begin();
                curr.fieldEnd = fields.end();
                curr.valIndex = 0;
                prepNext();
            }
        }
    }